

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::DeferDeserializeFunctionInfo::DeferDeserializeFunctionInfo
          (DeferDeserializeFunctionInfo *this,int nestedCount,LocalFunctionId functionId,
          ByteCodeCache *byteCodeCache,byte *serializedFunction,Utf8SourceInfo *sourceInfo,
          ScriptContext *scriptContext,uint functionNumber,char16 *displayName,
          uint displayNameLength,uint displayShortNameOffset,NativeModule *nativeModule,
          Attributes attributes)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  ProxyEntryPointInfo *this_01;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._36_4_ = functionId;
  FunctionProxy::FunctionProxy(&this->super_FunctionProxy,scriptContext,sourceInfo,functionNumber);
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01377158;
  Memory::WriteBarrierPtr<const_unsigned_char>::WriteBarrierSet
            (&this->m_functionBytes,serializedFunction);
  Memory::WriteBarrierPtr<Js::ByteCodeCache>::WriteBarrierSet(&this->m_cache,byteCodeCache);
  (this->m_displayName).ptr = (char16_t *)0x0;
  this->m_displayNameLength = 0;
  Memory::WriteBarrierPtr<Js::NativeModule>::WriteBarrierSet(&this->m_nativeModule,nativeModule);
  local_60 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x63e;
  pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x37a1d4);
  FunctionInfo::FunctionInfo
            (this_00,JavascriptFunction::DeferredDeserializeThunk,attributes | DeferredDeserialize,
             data._36_4_,&this->super_FunctionProxy);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierSet
            (&(this->super_FunctionProxy).functionInfo,this_00);
  local_60 = (undefined1  [8])&ProxyEntryPointInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x63f;
  pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  this_01 = (ProxyEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar1,0x37a1d4);
  ProxyEntryPointInfo::ProxyEntryPointInfo
            (this_01,JavascriptFunction::DeferredDeserializeThunk,(ThreadContext *)0x0);
  Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierSet
            (&(this->super_FunctionProxy).m_defaultEntryPointInfo,this_01);
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])
            (this,displayName,(ulong)displayNameLength,(ulong)displayShortNameOffset,1);
  return;
}

Assistant:

DeferDeserializeFunctionInfo::DeferDeserializeFunctionInfo(int nestedCount, LocalFunctionId functionId, ByteCodeCache* byteCodeCache, const byte* serializedFunction, Utf8SourceInfo* sourceInfo, ScriptContext* scriptContext, uint functionNumber, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, NativeModule *nativeModule, FunctionInfo::Attributes attributes) :
        FunctionProxy(scriptContext, sourceInfo, functionNumber),
        m_cache(byteCodeCache),
        m_functionBytes(serializedFunction),
        m_displayName(nullptr),
        m_displayNameLength(0),
        m_nativeModule(nativeModule)
    {
        this->functionInfo = RecyclerNew(scriptContext->GetRecycler(), FunctionInfo, DefaultDeferredDeserializeThunk, (FunctionInfo::Attributes)(attributes | FunctionInfo::Attributes::DeferredDeserialize), functionId, this);
        this->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, DefaultDeferredDeserializeThunk);
        PERF_COUNTER_INC(Code, DeferDeserializeFunctionProxy);

        SetDisplayName(displayName, displayNameLength, displayShortNameOffset, FunctionProxy::SetDisplayNameFlagsDontCopy);
    }